

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

PC * __thiscall
Hpipe::Context::forward(PC *__return_storage_ptr__,Context *this,int type,bool never_ending)

{
  CharItem *pCVar1;
  pointer pCVar2;
  bool bVar3;
  pointer ppCVar4;
  long lVar5;
  pointer pCVar6;
  ulong uVar7;
  uint ind;
  PcMaker pm;
  PcMaker local_c0;
  
  anon_unknown_7::PcMaker::PcMaker(&local_c0,this);
  ppCVar4 = (this->pos).
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->pos).super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar4) {
    uVar7 = 0;
    do {
      pCVar1 = ppCVar4[uVar7];
      ind = (uint)uVar7;
      if (pCVar1->type == type) {
        pCVar2 = (pCVar1->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                 super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pCVar6 = (pCVar1->edges).
                      super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                      super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
                      super__Vector_impl_data._M_start; pCVar6 != pCVar2; pCVar6 = pCVar6 + 1) {
          pCVar1 = pCVar6->item;
          lVar5 = (long)local_c0.res.first.pos.
                        super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                        .
                        super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c0.res.first.pos.
                        super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                        .
                        super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          bVar3 = lVar5 != 0;
          if (lVar5 == 0) {
LAB_00146106:
            if (!bVar3) {
              anon_unknown_7::PcMaker::add(&local_c0,pCVar1,ind,true);
              bVar3 = CharGraph::leads_to_ok((Vec<const_Hpipe::CharItem_*> *)&local_c0,never_ending)
              ;
              if (bVar3) {
                std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair
                          (__return_storage_ptr__,&local_c0.res);
                goto LAB_001461cd;
              }
            }
          }
          else if (*local_c0.res.first.pos.
                    super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                    super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_start != pCVar1) {
            uVar7 = 1;
            do {
              bVar3 = uVar7 < (ulong)(lVar5 >> 3);
              if ((ulong)(lVar5 >> 3) <= uVar7) goto LAB_00146106;
              ppCVar4 = local_c0.res.first.pos.
                        super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                        .
                        super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar7;
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (*ppCVar4 != pCVar1);
          }
        }
      }
      else {
        lVar5 = (long)local_c0.res.first.pos.
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c0.res.first.pos.
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = lVar5 != 0;
        if (lVar5 == 0) {
LAB_0014616b:
          if (!bVar3) {
            anon_unknown_7::PcMaker::add(&local_c0,pCVar1,ind,true);
            bVar3 = CharGraph::leads_to_ok((Vec<const_Hpipe::CharItem_*> *)&local_c0,never_ending);
            if (bVar3) {
              std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair
                        (__return_storage_ptr__,&local_c0.res);
              goto LAB_001461cd;
            }
          }
        }
        else if (*local_c0.res.first.pos.
                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != pCVar1) {
          uVar7 = 1;
          do {
            bVar3 = uVar7 < (ulong)(lVar5 >> 3);
            if ((ulong)(lVar5 >> 3) <= uVar7) goto LAB_0014616b;
            ppCVar4 = local_c0.res.first.pos.
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar7;
            uVar7 = (ulong)((int)uVar7 + 1);
          } while (*ppCVar4 != pCVar1);
        }
      }
      uVar7 = (ulong)(ind + 1);
      ppCVar4 = (this->pos).
                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->pos).
                                   super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                   .
                                   super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3))
    ;
  }
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair(__return_storage_ptr__,&local_c0.res);
LAB_001461cd:
  if (local_c0.res.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.res.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.res.second.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.res.second.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::~_Rb_tree(&local_c0.res.first.paths_to_strings._M_t);
  if (local_c0.res.first.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.res.first.paths_to_mark.
                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.res.first.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.res.first.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.res.first.pos.
      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.res.first.pos.
                    super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                    super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.res.first.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.res.first.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::forward( int type, bool never_ending ) const {
    PcMaker pm( this );

    for( unsigned i = 0; i < pos.size(); ++i ) {
        const CharItem *item = pos[ i ];
        if ( item->type == type ) {
            for( const CharEdge &e : item->edges ) {
                if ( not pm.has( e.item ) ) {
                    pm.add( e.item, i );
                    if ( pm.leads_to_ok( never_ending ) )
                        return pm.out();
                }
            }
        } else if ( not pm.has( item ) ) {
            pm.add( item, i );
            if ( pm.leads_to_ok( never_ending ) )
                return pm.out();
        }
    }

    return pm.out();
}